

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O0

vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_true> * __thiscall
duckdb::Relation::GetAllDependencies(Relation *this)

{
  bool bVar1;
  __normal_iterator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>_>
  *in_RSI;
  vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  *in_RDI;
  shared_ptr<duckdb::ExternalDependency,_true> *dep;
  iterator __end2;
  iterator __begin2;
  vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_true> *__range2;
  Relation *cur;
  vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_true> *all_dependencies;
  vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  *in_stack_ffffffffffffff88;
  __normal_iterator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>_>
  *in_stack_ffffffffffffff90;
  vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  *this_00;
  __normal_iterator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>_>
  local_30;
  __normal_iterator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>_>
  *local_28;
  __normal_iterator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>_>
  *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_true>::vector
            ((vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_true> *)0x898dff);
  local_20 = in_RSI;
  while (local_20 !=
         (__normal_iterator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>_>
          *)0x0) {
    local_28 = local_20 + 10;
    local_30._M_current =
         (shared_ptr<duckdb::ExternalDependency,_true> *)
         ::std::
         vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
         ::begin(in_stack_ffffffffffffff88);
    ::std::
    vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
    ::end(in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff90,
                              (__normal_iterator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>_>
                               *)in_stack_ffffffffffffff88), bVar1) {
      __gnu_cxx::
      __normal_iterator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>_>
      ::operator*(&local_30);
      ::std::
      vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
      ::push_back(this_00,(value_type *)in_RDI);
      __gnu_cxx::
      __normal_iterator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>_>
      ::operator++(&local_30);
    }
    in_stack_ffffffffffffff90 =
         (__normal_iterator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>_>
          *)(*(code *)local_20->_M_current[6].internal.
                      super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)();
    local_20 = in_stack_ffffffffffffff90;
  }
  return (vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_true> *)this_00;
}

Assistant:

vector<shared_ptr<ExternalDependency>> Relation::GetAllDependencies() {
	vector<shared_ptr<ExternalDependency>> all_dependencies;
	Relation *cur = this;
	while (cur) {
		for (auto &dep : cur->external_dependencies) {
			all_dependencies.push_back(dep);
		}
		cur = cur->ChildRelation();
	}
	return all_dependencies;
}